

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filename.cpp
# Opt level: O2

FileName * __thiscall
embree::FileName::addExt(FileName *__return_storage_ptr__,FileName *this,string *ext)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,&this->filename,ext);
  FileName(__return_storage_ptr__,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

FileName FileName::addExt(const std::string& ext) const {
    return FileName(filename+ext);
  }